

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_logger.cpp
# Opt level: O0

void __thiscall
duckdb::SQLLogicTestLogger::WrongRowCount
          (SQLLogicTestLogger *this,idx_t expected_rows,MaterializedQueryResult *result,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *comparison_values,idx_t expected_column_count,bool row_wise)

{
  ostream *poVar1;
  void *pvVar2;
  ulong uVar3;
  ulong in_RSI;
  idx_t in_RDI;
  byte in_R9B;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *unaff_retaddr;
  MaterializedQueryResult *in_stack_00000008;
  SQLLogicTestLogger *in_stack_00000010;
  string *in_stack_ffffffffffffff78;
  SQLLogicTestLogger *in_stack_ffffffffffffff80;
  allocator local_51;
  string local_50 [39];
  byte local_29;
  undefined1 row_wise_00;
  
  local_29 = in_R9B & 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"Wrong row count in query!",&local_51);
  PrintErrorHeader(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  poVar1 = std::operator<<((ostream *)&std::cerr,"Expected ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,termcolor::bold);
  pvVar2 = (void *)std::ostream::operator<<(pvVar2,in_RSI);
  row_wise_00 = (undefined1)(in_RSI >> 0x38);
  poVar1 = (ostream *)std::ostream::operator<<(pvVar2,termcolor::reset);
  poVar1 = std::operator<<(poVar1," rows, but got ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,termcolor::bold);
  uVar3 = duckdb::MaterializedQueryResult::RowCount();
  pvVar2 = (void *)std::ostream::operator<<(pvVar2,uVar3);
  poVar1 = (ostream *)std::ostream::operator<<(pvVar2,termcolor::reset);
  poVar1 = std::operator<<(poVar1," rows");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  PrintLineSep();
  PrintSQL(this);
  PrintLineSep();
  PrintResultError(in_stack_00000010,in_stack_00000008,unaff_retaddr,in_RDI,(bool)row_wise_00);
  return;
}

Assistant:

void SQLLogicTestLogger::WrongRowCount(idx_t expected_rows, MaterializedQueryResult &result,
                                       const vector<string> &comparison_values, idx_t expected_column_count,
                                       bool row_wise) {
	PrintErrorHeader("Wrong row count in query!");
	std::cerr << "Expected " << termcolor::bold << expected_rows << termcolor::reset << " rows, but got "
	          << termcolor::bold << result.RowCount() << termcolor::reset << " rows" << std::endl;
	PrintLineSep();
	PrintSQL();
	PrintLineSep();
	PrintResultError(result, comparison_values, expected_column_count, row_wise);
}